

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopll.c
# Opt level: O3

void nukedopll_update(void *chipptr,UINT32 samples,DEV_SMPL **out)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  int *piVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  int32_t buffer [2];
  int local_98;
  int local_94;
  ulong local_90;
  DEV_SMPL **local_88;
  ulong local_80;
  int *local_78;
  int *local_70;
  int *local_68;
  int *local_60;
  int *local_58;
  int *local_50;
  int *local_48;
  int *local_40;
  int *local_38;
  
  if (samples != 0) {
    local_40 = (int *)((long)chipptr + 0x1ac);
    local_48 = (int *)((long)chipptr + 0x1a8);
    local_50 = (int *)((long)chipptr + 0x1a4);
    local_58 = (int *)((long)chipptr + 0x1a0);
    local_60 = (int *)((long)chipptr + 0x19c);
    local_38 = (int *)((long)chipptr + 0x198);
    local_68 = (int *)((long)chipptr + 0x1b8);
    local_70 = (int *)((long)chipptr + 0x1b4);
    local_78 = (int *)((long)chipptr + 0x1b0);
    local_90 = (ulong)samples;
    local_80 = 0;
    local_88 = out;
    do {
      iVar12 = *(int *)((long)chipptr + 0x1d0);
      iVar11 = *(int *)((long)chipptr + 0x1d4);
      iVar8 = *(int *)((long)chipptr + 0x1e0);
      iVar6 = *(int *)((long)chipptr + 0x1e4);
      if (iVar12 <= iVar11) {
        do {
          *(int *)((long)chipptr + 0x1d8) = iVar8;
          *(int *)((long)chipptr + 0x1dc) = iVar6;
          *(undefined8 *)((long)chipptr + 0x1e0) = 0;
          iVar12 = 0;
          do {
            iVar11 = 0;
            piVar5 = local_38;
            iVar8 = 0;
            switch(*(undefined4 *)((long)chipptr + 0x14)) {
            case 1:
              piVar5 = local_78;
              iVar8 = *(int *)((long)chipptr + 0x1bc);
              goto switchD_00125a9a_caseD_7;
            case 2:
              piVar5 = local_70;
              iVar8 = *(int *)((long)chipptr + 0x1c0);
              goto switchD_00125a9a_caseD_7;
            case 3:
              piVar5 = local_68;
              iVar8 = *(int *)((long)chipptr + 0x1c8);
              goto switchD_00125a9a_caseD_7;
            case 4:
            case 0x11:
              iVar11 = *(int *)((long)chipptr + 0x1cc);
              break;
            default:
              iVar11 = *(int *)((long)chipptr + 0x1c4);
              break;
            case 6:
              iVar11 = *(int *)((long)chipptr + 0x1bc);
              break;
            case 7:
              goto switchD_00125a9a_caseD_7;
            case 8:
              piVar5 = local_60;
              goto LAB_00125b22;
            case 9:
              piVar5 = local_58;
              goto LAB_00125b22;
            case 10:
              iVar11 = *(int *)((long)chipptr + 0x1c0);
              break;
            case 0xb:
              iVar11 = *(int *)((long)chipptr + 0x1c8);
              break;
            case 0xc:
            case 0x10:
              break;
            case 0xd:
              piVar5 = local_50;
              goto LAB_00125b22;
            case 0xe:
              piVar5 = local_48;
              goto LAB_00125b22;
            case 0xf:
              piVar5 = local_40;
LAB_00125b22:
              iVar8 = 0;
switchD_00125a9a_caseD_7:
              iVar11 = iVar8;
              iVar8 = *piVar5;
              NOPLL_Clock((opll_t *)chipptr,&local_98);
              if (iVar8 == 0) goto LAB_00125b36;
              goto LAB_00125b40;
            }
            NOPLL_Clock((opll_t *)chipptr,&local_98);
LAB_00125b36:
            *(int *)((long)chipptr + 0x1e0) = *(int *)((long)chipptr + 0x1e0) + local_98;
LAB_00125b40:
            if (iVar11 == 0) {
              *(int *)((long)chipptr + 0x1e4) = *(int *)((long)chipptr + 0x1e4) + local_94;
            }
            uVar3 = *(ulong *)((long)chipptr + 0x1e8);
            uVar9 = (ulong)*(uint *)((long)chipptr + 0x1f0);
            uVar10 = uVar9 * 0x10;
            uVar4 = *(ulong *)((long)chipptr + uVar10 + 0x200);
            while ((uVar4 <= uVar3 &&
                   (bVar1 = *(byte *)((long)chipptr + uVar10 + 0x208), (bVar1 & 4) != 0))) {
              *(byte *)((long)chipptr + uVar10 + 0x208) = bVar1 & 3;
              *(undefined1 *)((long)chipptr + 0x28) =
                   *(undefined1 *)((long)chipptr + uVar10 + 0x209);
              if ((bVar1 & 1) == 0) {
                *(byte *)((long)chipptr + 0x29) = *(byte *)((long)chipptr + 0x29) | 1;
              }
              else {
                *(byte *)((long)chipptr + 0x2a) = *(byte *)((long)chipptr + 0x2a) | 1;
              }
              uVar7 = (int)uVar9 + 1U & 0x7ff;
              uVar9 = (ulong)uVar7;
              *(uint *)((long)chipptr + 0x1f0) = uVar7;
              uVar10 = (ulong)(uVar7 << 4);
              uVar4 = *(ulong *)((long)chipptr + uVar10 + 0x200);
            }
            *(ulong *)((long)chipptr + 0x1e8) = uVar3 + 1;
            iVar12 = iVar12 + 1;
          } while (iVar12 != 0x12);
          iVar8 = (*(int *)((long)chipptr + 0x1e4) + *(int *)((long)chipptr + 0x1e0)) * 8;
          *(int *)((long)chipptr + 0x1e0) = iVar8;
          *(int *)((long)chipptr + 0x1e4) = iVar8;
          iVar12 = *(int *)((long)chipptr + 0x1d0);
          iVar11 = *(int *)((long)chipptr + 0x1d4) - iVar12;
          *(int *)((long)chipptr + 0x1d4) = iVar11;
          iVar6 = iVar8;
        } while (iVar12 <= iVar11);
      }
      iVar2 = *(int *)((long)chipptr + 0x1dc);
      *(int *)((long)chipptr + 0x1d4) = iVar11 + 0x400;
      (*local_88)[local_80] =
           (iVar8 * iVar11 + *(int *)((long)chipptr + 0x1d8) * (iVar12 - iVar11)) / iVar12;
      local_88[1][local_80] = (iVar6 * iVar11 + (iVar12 - iVar11) * iVar2) / iVar12;
      local_80 = local_80 + 1;
    } while (local_80 != local_90);
  }
  return;
}

Assistant:

static void nukedopll_update(void *chipptr, UINT32 samples, DEV_SMPL **out)
{
	opll_t *chip = (opll_t *)chipptr;
	int32_t buffer[2];
	UINT32 i;
	
	for (i = 0; i < samples; i ++)
	{
		OPLL_GenerateResampled(chip, buffer);
		out[0][i] = buffer[0];
		out[1][i] = buffer[1];
	}
	
	return;
}